

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

hugeint_t __thiscall
duckdb::WindowQuantileState<duckdb::hugeint_t>::WindowScalar<duckdb::hugeint_t,true>
          (WindowQuantileState<duckdb::hugeint_t> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_true> *dest;
  duckdb *this_00;
  uint64_t uVar1;
  bool bVar2;
  pointer this_01;
  pointer pHVar3;
  idx_t index;
  reference pvVar4;
  InternalException *this_02;
  InvalidInputException *this_03;
  int64_t iVar5;
  hugeint_t hVar6;
  hugeint_t result_1;
  string local_60;
  hugeint_t local_40;
  
  if ((QuantileSortTree *)
      (this->qst).
      super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
      .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
    this_01 = unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
              ::operator->(&this->qst);
    hVar6 = QuantileSortTree::WindowScalar<duckdb::hugeint_t,duckdb::hugeint_t,true>
                      (this_01,data,frames,n,result,q);
    return hVar6;
  }
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
       *)0x0) {
    pHVar3 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>,_true>
             ::operator->(&this->s);
    index = Interpolator<true>::Index(q,pHVar3->_count);
    pHVar3 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>,_true>
             ::operator->(&this->s);
    dest = &this->skips;
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
    ::at(pHVar3,index,1,
         &dest->
          super_vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
        );
    pvVar4 = vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_true>::operator[](dest,0);
    this_00 = (duckdb *)(pvVar4->second).lower;
    uVar1 = (pvVar4->second).upper;
    hVar6 = pvVar4->second;
    vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_true>::operator[]
              (dest,(ulong)(1 < (ulong)(((long)(this->skips).
                                               super_vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                                               .
                                               super__Vector_base<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->skips).
                                               super_vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                                               .
                                               super__Vector_base<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x5555555555555555)));
    iVar5 = 0;
    bVar2 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar6,&local_40,false);
    if (bVar2) {
      return local_40;
    }
    this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    hVar6.upper = iVar5;
    hVar6.lower = uVar1;
    CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_60,this_00,hVar6);
    InvalidInputException::InvalidInputException(this_03,&local_60);
    __cxa_throw(this_03,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"No accelerator for scalar QUANTILE","");
  InternalException::InternalException(this_02,&local_60);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}